

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O2

string * common_sampler_print_abi_cxx11_(string *__return_storage_ptr__,common_sampler *gsmpl)

{
  int iVar1;
  undefined8 uVar2;
  char *__rhs;
  int iVar3;
  allocator<char> local_99;
  string *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"logits ",(allocator<char> *)&local_50);
  iVar3 = 0;
  while( true ) {
    iVar1 = llama_sampler_chain_n(gsmpl->chain);
    if (iVar1 <= iVar3) break;
    uVar2 = llama_sampler_chain_get(gsmpl->chain,iVar3);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"-> ",&local_99);
    __rhs = (char *)llama_sampler_name(uVar2);
    std::operator+(&local_70,&local_90,__rhs);
    std::operator+(&local_50,&local_70," ");
    std::__cxx11::string::append((string *)local_98);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    iVar3 = iVar3 + 1;
  }
  return local_98;
}

Assistant:

std::string common_sampler_print(const struct common_sampler * gsmpl) {
    std::string result = "logits ";

    for (int i = 0; i < llama_sampler_chain_n(gsmpl->chain); i++) {
        const auto * smpl = llama_sampler_chain_get(gsmpl->chain, i);
        result += std::string("-> ") + llama_sampler_name(smpl) + " ";
    }

    return result;
}